

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

MaxBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_maxbroadcastable(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x36b) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x36b;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    MaxBroadcastableLayerParams::MaxBroadcastableLayerParams(this_00.maxbroadcastable_);
    (this->layer_).maxbroadcastable_ = (MaxBroadcastableLayerParams *)this_00;
  }
  return (MaxBroadcastableLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::MaxBroadcastableLayerParams* NeuralNetworkLayer::mutable_maxbroadcastable() {
  if (!has_maxbroadcastable()) {
    clear_layer();
    set_has_maxbroadcastable();
    layer_.maxbroadcastable_ = new ::CoreML::Specification::MaxBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.maxBroadcastable)
  return layer_.maxbroadcastable_;
}